

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

GenerateBlockArraySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          uint *args_3)

{
  uint32_t uVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  GenerateBlockArraySymbol *thisSym_;
  
  thisSym_ = (GenerateBlockArraySymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((GenerateBlockArraySymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (GenerateBlockArraySymbol *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar3 = args_1->_M_len;
  pcVar4 = args_1->_M_str;
  SVar2 = *args_2;
  uVar1 = *args_3;
  (thisSym_->super_Symbol).kind = GenerateBlockArray;
  (thisSym_->super_Symbol).name._M_len = sVar3;
  (thisSym_->super_Symbol).name._M_str = pcVar4;
  (thisSym_->super_Symbol).location = SVar2;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  (thisSym_->entries).data_ = (pointer)0x0;
  (thisSym_->entries).size_ = 0;
  thisSym_->constructIndex = uVar1;
  thisSym_->valid = false;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }